

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
          *samples)

{
  int iVar1;
  RenderSampleAnalyzeResult RVar2;
  const_reference pvVar3;
  TestLog *pTVar4;
  offset_in_SampleType_to_deUint64 in_RCX;
  allocator<char> local_c81;
  string local_c80;
  allocator<char> local_c59;
  string local_c58;
  allocator<char> local_c31;
  string local_c30;
  LogNumber<float> local_c10;
  allocator<char> local_ba1;
  string local_ba0;
  allocator<char> local_b79;
  string local_b78;
  allocator<char> local_b51;
  string local_b50;
  LogNumber<float> local_b30;
  allocator<char> local_ac1;
  string local_ac0;
  allocator<char> local_a99;
  string local_a98;
  allocator<char> local_a71;
  string local_a70;
  LogNumber<float> local_a50;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  LogNumber<float> local_970;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  LogNumber<float> local_890;
  allocator<char> local_821;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  LogNumber<float> local_7b0;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  LogNumber<float> local_6d0;
  allocator<char> local_661;
  string local_660;
  allocator<char> local_639;
  string local_638;
  allocator<char> local_611;
  string local_610;
  LogNumber<float> local_5f0;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  LogNumber<float> local_510;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  LogNumber<float> local_430;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  LogNumber<float> local_350;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  LogNumber<float> local_270;
  float local_208;
  float local_204;
  float sampleTemporalStability;
  float sampleLinearity;
  float approximatedRenderTimeNoConstant;
  float approximatedRenderTime;
  int medianDataSize;
  allocator<char> local_1c9;
  string local_1c8;
  ScopedLogSection local_1a8;
  ScopedLogSection section_2;
  string local_198;
  allocator<char> local_171;
  string local_170;
  ScopedLogSection local_150;
  ScopedLogSection section_1;
  string local_140;
  allocator<char> local_109;
  string local_108;
  ScopedLogSection local_e8;
  ScopedLogSection section;
  float approximatedProcessingRateNoConstant;
  float approximatedProcessingRate;
  StatsType resultStats;
  LineParametersWithConfidence theilSenFitting;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  *samples_local;
  TestLog *log_local;
  RenderSampleAnalyzeResult result;
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
            ((LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,
             (_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              *)0x30,in_RCX);
  calculateSampleStatistics
            ((RenderUploadRenderReadStatistics *)&approximatedProcessingRateNoConstant,
             (LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Samples",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Samples",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_e8,log,&local_108,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  logSampleList(log,(LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  tcu::ScopedLogSection::~ScopedLogSection(&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Contribution",&local_171)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Contributions",(allocator<char> *)((long)&section_2.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_150,log,&local_170,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  logFirstRenderContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logUploadContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logRenderContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logSecondRenderContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logReadContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logTotalContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  tcu::ScopedLogSection::~ScopedLogSection(&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"Results",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&medianDataSize,"Results",
             (allocator<char> *)((long)&approximatedRenderTime + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_1a8,log,&local_1c8,(string *)&medianDataSize);
  std::__cxx11::string::~string((string *)&medianDataSize);
  std::allocator<char>::~allocator((allocator<char> *)((long)&approximatedRenderTime + 3));
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pvVar3 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           ::front(samples);
  iVar1 = pvVar3->renderDataSize;
  pvVar3 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
           ::back(samples);
  approximatedRenderTimeNoConstant = (float)((iVar1 + pvVar3->renderDataSize) / 2);
  sampleLinearity =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedRenderTimeNoConstant +
        resultStats.max9DecileRelDiffTime) / 1000.0) / 1000.0;
  sampleTemporalStability =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedRenderTimeNoConstant) /
       1000.0) / 1000.0;
  local_204 = calculateSampleFitLinearity<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                        (samples);
  local_208 = calculateSampleTemporalStability<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                        (samples);
  section.m_log._0_4_ = (float)(int)approximatedRenderTimeNoConstant / sampleTemporalStability;
  section.m_log._4_4_ = (float)(int)approximatedRenderTimeNoConstant / sampleLinearity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"ResultLinearity",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"Sample linearity",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"%",&local_2e1);
  tcu::LogNumber<float>::LogNumber
            (&local_270,&local_290,&local_2b8,&local_2e0,QP_KEY_TAG_QUALITY,local_204 * 100.0);
  pTVar4 = tcu::TestLog::operator<<(log,&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"SampleTemporalStability",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"Sample temporal stability",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"%",&local_3c1);
  tcu::LogNumber<float>::LogNumber
            (&local_350,&local_370,&local_398,&local_3c0,QP_KEY_TAG_QUALITY,local_208 * 100.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"ApproximatedConstantCost",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"Approximated contant cost",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"us",&local_4a1);
  tcu::LogNumber<float>::LogNumber
            (&local_430,&local_450,&local_478,&local_4a0,QP_KEY_TAG_TIME,
             resultStats.max9DecileRelDiffTime);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"ApproximatedConstantCostConfidence60Lower",&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"Approximated contant cost 60% confidence lower limit",&local_559)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"us",&local_581);
  tcu::LogNumber<float>::LogNumber
            (&local_510,&local_530,&local_558,&local_580,QP_KEY_TAG_TIME,theilSenFitting.offset);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"ApproximatedConstantCostConfidence60Upper",&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"Approximated contant cost 60% confidence upper limit",&local_639)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"us",&local_661);
  tcu::LogNumber<float>::LogNumber
            (&local_5f0,&local_610,&local_638,&local_660,QP_KEY_TAG_TIME,
             resultStats.medianRelDiffTime);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_5f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"ApproximatedLinearCost",&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"Approximated linear cost",&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"us / MB",&local_741);
  tcu::LogNumber<float>::LogNumber
            (&local_6d0,&local_6f0,&local_718,&local_740,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper * 1024.0 * 1024.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_6d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d0,"ApproximatedLinearCostConfidence60Lower",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"Approximated linear cost 60% confidence lower limit",&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"us / MB",&local_821);
  tcu::LogNumber<float>::LogNumber
            (&local_7b0,&local_7d0,&local_7f8,&local_820,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"ApproximatedLinearCostConfidence60Upper",&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"Approximated linear cost 60% confidence upper limit",&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"us / MB",&local_901);
  tcu::LogNumber<float>::LogNumber
            (&local_890,&local_8b0,&local_8d8,&local_900,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower * 1024.0 * 1024.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_890);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_990,"ApproximatedProcessRate",&local_991);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b8,"Approximated processing rate",&local_9b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"MB / s",&local_9e1);
  tcu::LogNumber<float>::LogNumber
            (&local_970,&local_990,&local_9b8,&local_9e0,QP_KEY_TAG_PERFORMANCE,
             section.m_log._4_4_ * 0.0009765625 * 0.0009765625);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_970);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a70,"ApproximatedProcessRateNoConstant",&local_a71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a98,"Approximated processing rate without constant cost",&local_a99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,"MB / s",&local_ac1);
  tcu::LogNumber<float>::LogNumber
            (&local_a50,&local_a70,&local_a98,&local_ac0,QP_KEY_TAG_PERFORMANCE,
             section.m_log._0_4_ * 0.0009765625 * 0.0009765625);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_a50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b50,"SampleMedianTime",&local_b51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b78,"Median sample time",&local_b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,"us",&local_ba1);
  tcu::LogNumber<float>::LogNumber
            (&local_b30,&local_b50,&local_b78,&local_ba0,QP_KEY_TAG_TIME,resultStats.result.minTime)
  ;
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_b30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c30,"SampleMedianProcess",&local_c31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c58,"Median processing rate",&local_c59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c80,"MB / s",&local_c81);
  tcu::LogNumber<float>::LogNumber
            (&local_c10,&local_c30,&local_c58,&local_c80,QP_KEY_TAG_PERFORMANCE,
             resultStats.total.min2DecileTime * 0.0009765625 * 0.0009765625);
  tcu::TestLog::operator<<(pTVar4,&local_c10);
  tcu::LogNumber<float>::~LogNumber(&local_c10);
  std::__cxx11::string::~string((string *)&local_c80);
  std::allocator<char>::~allocator(&local_c81);
  std::__cxx11::string::~string((string *)&local_c58);
  std::allocator<char>::~allocator(&local_c59);
  std::__cxx11::string::~string((string *)&local_c30);
  std::allocator<char>::~allocator(&local_c31);
  tcu::LogNumber<float>::~LogNumber(&local_b30);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator(&local_ba1);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator(&local_b79);
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator(&local_b51);
  tcu::LogNumber<float>::~LogNumber(&local_a50);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::allocator<char>::~allocator(&local_ac1);
  std::__cxx11::string::~string((string *)&local_a98);
  std::allocator<char>::~allocator(&local_a99);
  std::__cxx11::string::~string((string *)&local_a70);
  std::allocator<char>::~allocator(&local_a71);
  tcu::LogNumber<float>::~LogNumber(&local_970);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  tcu::LogNumber<float>::~LogNumber(&local_890);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  tcu::LogNumber<float>::~LogNumber(&local_7b0);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator(&local_821);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  tcu::LogNumber<float>::~LogNumber(&local_6d0);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator(&local_6f1);
  tcu::LogNumber<float>::~LogNumber(&local_5f0);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator(&local_611);
  tcu::LogNumber<float>::~LogNumber(&local_510);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  tcu::LogNumber<float>::~LogNumber(&local_430);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  tcu::LogNumber<float>::~LogNumber(&local_350);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  tcu::LogNumber<float>::~LogNumber(&local_270);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1a8);
  RVar2.renderRateAtRange = section.m_log._4_4_;
  RVar2.renderRateMedian = resultStats.total.min2DecileTime;
  RVar2.renderRateAtInfinity = section.m_log._0_4_;
  return RVar2;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}